

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O3

float miniply::angle_at_vert
                (uint32_t idx,vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> *points2D,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *prev,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *next)

{
  pointer pVVar1;
  pointer pVVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  uVar3 = (ulong)idx;
  pVVar1 = (&(points2D->super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>)._M_impl.
             super__Vector_impl_data._M_start)
           [*(uint *)((long)&(next->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                             ._M_impl.super__Vector_impl_data._M_start + uVar3 * 4)];
  pVVar2 = (&(points2D->super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>)._M_impl.
             super__Vector_impl_data._M_start)[uVar3];
  fVar5 = SUB84(pVVar2,0);
  fVar7 = SUB84(pVVar1,0) - fVar5;
  fVar6 = (float)((ulong)pVVar2 >> 0x20);
  fVar8 = (float)((ulong)pVVar1 >> 0x20) - fVar6;
  fVar4 = SQRT(fVar7 * fVar7 + fVar8 * fVar8);
  fVar7 = fVar7 / fVar4;
  fVar8 = fVar8 / fVar4;
  pVVar1 = (&(points2D->super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>)._M_impl.
             super__Vector_impl_data._M_start)
           [*(uint *)((long)&(prev->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                             ._M_impl.super__Vector_impl_data._M_start + uVar3 * 4)];
  fVar5 = SUB84(pVVar1,0) - fVar5;
  fVar6 = (float)((ulong)pVVar1 >> 0x20) - fVar6;
  fVar5 = atan2f(fVar6 * fVar7 - fVar5 * fVar8,fVar5 * fVar7 + fVar6 * fVar8);
  return (float)(-(uint)(fVar5 <= 0.0) & 0x461c4000 |
                ~-(uint)(fVar5 <= 0.0) &
                (-(uint)(3.1415927 <= fVar5) & 0x461c4000 |
                ~-(uint)(3.1415927 <= fVar5) & (uint)fVar5));
}

Assistant:

static float angle_at_vert(uint32_t idx,
                             const std::vector<Vec2>& points2D,
                             const std::vector<uint32_t>& prev,
                             const std::vector<uint32_t>& next)
  {
    Vec2 xaxis = normalize(points2D[next[idx]] - points2D[idx]);
    Vec2 yaxis = Vec2{-xaxis.y, xaxis.x};
    Vec2 p2p0 = points2D[prev[idx]] - points2D[idx];
    float angle = std::atan2(dot(p2p0, yaxis), dot(p2p0, xaxis));
    if (angle <= 0.0f || angle >= kPi) {
      angle = 10000.0f;
    }
    return angle;
  }